

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

FuncDef * sqlite3VtabOverloadFunction(sqlite3 *db,FuncDef *pDef,int nArg,Expr *pExpr)

{
  Window *pWVar1;
  code *pcVar2;
  char *__s;
  undefined2 uVar3;
  u32 uVar4;
  int iVar5;
  size_t sVar6;
  FuncDef *pFVar7;
  long lVar8;
  u64 n;
  FuncDef *pFVar9;
  FuncDef *pFVar10;
  long in_FS_OFFSET;
  byte bVar11;
  void *pArg;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc;
  void *local_30;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *local_28;
  long local_20;
  
  bVar11 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0;
  local_30 = (void *)0x0;
  if ((((pExpr != (Expr *)0x0) && (pExpr->op == 0xa8)) &&
      (pWVar1 = (pExpr->y).pWin, pWVar1 != (Window *)0x0)) &&
     (*(char *)((long)&pWVar1->ppThis + 7) == '\x01')) {
    for (pFVar7 = pWVar1->pWFunc; (pFVar7 != (FuncDef *)0x0 && (*(sqlite3 **)pFVar7 != db));
        pFVar7 = (FuncDef *)pFVar7->xValue) {
    }
    pcVar2 = *(code **)(*(long *)pFVar7->pNext + 0x90);
    if ((pcVar2 != (code *)0x0) &&
       (iVar5 = (*pcVar2)(pFVar7->pNext,nArg,pDef->zName,&local_28,&local_30), iVar5 != 0)) {
      if (pDef->zName == (char *)0x0) {
        n = 0x49;
      }
      else {
        sVar6 = strlen(pDef->zName);
        n = (ulong)((uint)sVar6 & 0x3fffffff) + 0x49;
      }
      pFVar7 = (FuncDef *)sqlite3DbMallocZero(db,n);
      if (pFVar7 != (FuncDef *)0x0) {
        pFVar9 = pDef;
        pFVar10 = pFVar7;
        for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
          uVar3 = *(undefined2 *)&pFVar9->field_0x2;
          uVar4 = pFVar9->funcFlags;
          pFVar10->nArg = pFVar9->nArg;
          *(undefined2 *)&pFVar10->field_0x2 = uVar3;
          pFVar10->funcFlags = uVar4;
          pFVar9 = (FuncDef *)((long)pFVar9 + (ulong)bVar11 * -0x10 + 8);
          pFVar10 = (FuncDef *)((long)pFVar10 + (ulong)bVar11 * -0x10 + 8);
        }
        pFVar7->zName = (char *)(pFVar7 + 1);
        __s = pDef->zName;
        if (__s == (char *)0x0) {
          sVar6 = 1;
        }
        else {
          sVar6 = strlen(__s);
          sVar6 = (ulong)((uint)sVar6 & 0x3fffffff) + 1;
        }
        memcpy(pFVar7 + 1,__s,sVar6);
        pFVar7->xSFunc = local_28;
        pFVar7->pUserData = local_30;
        *(byte *)&pFVar7->funcFlags = (byte)pFVar7->funcFlags | 0x10;
        pDef = pFVar7;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return pDef;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3VtabOverloadFunction(
  sqlite3 *db,    /* Database connection for reporting malloc problems */
  FuncDef *pDef,  /* Function to possibly overload */
  int nArg,       /* Number of arguments to the function */
  Expr *pExpr     /* First argument to the function */
){
  Table *pTab;
  sqlite3_vtab *pVtab;
  sqlite3_module *pMod;
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value**) = 0;
  void *pArg = 0;
  FuncDef *pNew;
  int rc = 0;

  /* Check to see the left operand is a column in a virtual table */
  if( NEVER(pExpr==0) ) return pDef;
  if( pExpr->op!=TK_COLUMN ) return pDef;
  assert( ExprUseYTab(pExpr) );
  pTab = pExpr->y.pTab;
  if( NEVER(pTab==0) ) return pDef;
  if( !IsVirtual(pTab) ) return pDef;
  pVtab = sqlite3GetVTable(db, pTab)->pVtab;
  assert( pVtab!=0 );
  assert( pVtab->pModule!=0 );
  pMod = (sqlite3_module *)pVtab->pModule;
  if( pMod->xFindFunction==0 ) return pDef;

  /* Call the xFindFunction method on the virtual table implementation
  ** to see if the implementation wants to overload this function.
  **
  ** Though undocumented, we have historically always invoked xFindFunction
  ** with an all lower-case function name.  Continue in this tradition to
  ** avoid any chance of an incompatibility.
  */
#ifdef SQLITE_DEBUG
  {
    int i;
    for(i=0; pDef->zName[i]; i++){
      unsigned char x = (unsigned char)pDef->zName[i];
      assert( x==sqlite3UpperToLower[x] );
    }
  }
#endif
  rc = pMod->xFindFunction(pVtab, nArg, pDef->zName, &xSFunc, &pArg);
  if( rc==0 ){
    return pDef;
  }

  /* Create a new ephemeral function definition for the overloaded
  ** function */
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew)
                             + sqlite3Strlen30(pDef->zName) + 1);
  if( pNew==0 ){
    return pDef;
  }
  *pNew = *pDef;
  pNew->zName = (const char*)&pNew[1];
  memcpy((char*)&pNew[1], pDef->zName, sqlite3Strlen30(pDef->zName)+1);
  pNew->xSFunc = xSFunc;
  pNew->pUserData = pArg;
  pNew->funcFlags |= SQLITE_FUNC_EPHEM;
  return pNew;
}